

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_copy_internal(fy_document *fyd,fy_node *fyn_from,fy_node *fyn_parent)

{
  byte bVar1;
  int iVar2;
  fy_token *pfVar3;
  fy_node *pfVar4;
  undefined4 uStack_78;
  int rc;
  size_t anchor_len;
  char *anchor;
  fy_anchor *fya_from;
  fy_anchor *fya;
  fy_node_pair *fynpt;
  fy_node_pair *fynp;
  fy_node *fynit;
  fy_node *fyni;
  fy_node *fyn;
  fy_document *fyd_from;
  fy_node *fyn_parent_local;
  fy_node *fyn_from_local;
  fy_document *fyd_local;
  
  if (((fyd == (fy_document *)0x0) || (fyn_from == (fy_node *)0x0)) ||
     (fyn_from->fyd == (fy_document *)0x0)) {
    return (fy_node *)0x0;
  }
  fyn = (fy_node *)fyn_from->fyd;
  fyd_from = (fy_document *)fyn_parent;
  fyn_parent_local = fyn_from;
  fyn_from_local = (fy_node *)fyd;
  fyni = fy_node_alloc(fyd,(uint)(fyn_from->field_0x34 & 3));
  if (fyni == (fy_node *)0x0) {
    fy_document_diag((fy_document *)fyn_from_local,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x712,"fy_node_copy_internal","fy_node_alloc() failed");
    goto LAB_00128e90;
  }
  pfVar3 = fy_token_ref(fyn_parent_local->tag);
  fyni->tag = pfVar3;
  fyni->style = fyn_parent_local->style;
  fyni->parent = (fy_node *)fyd_from;
  bVar1 = fyni->field_0x34 & 3;
  if ((fyni->field_0x34 & 3) == 0) {
    pfVar3 = fy_token_ref((fyn_parent_local->field_12).scalar);
    (fyni->field_12).scalar = pfVar3;
  }
  else if (bVar1 == 1) {
    for (fynit = fy_node_list_head(&(fyn_parent_local->field_12).sequence); fynit != (fy_node *)0x0;
        fynit = fy_node_next(&(fyn_parent_local->field_12).sequence,fynit)) {
      fynp = (fy_node_pair *)fy_node_copy_internal((fy_document *)fyn_from_local,fynit,fyni);
      if ((fy_node *)fynp == (fy_node *)0x0) {
        fy_document_diag((fy_document *)fyn_from_local,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x723,"fy_node_copy_internal","fy_node_copy_internal() failed");
        goto LAB_00128e90;
      }
      fy_node_list_add_tail(&(fyni->field_12).sequence,(fy_node *)fynp);
      *(byte *)((long)&fynp[1].node.next + 4) = *(byte *)((long)&fynp[1].node.next + 4) & 0xf7 | 8;
    }
  }
  else if (bVar1 == 2) {
    for (fynpt = fy_node_pair_list_head(&(fyn_parent_local->field_12).mapping);
        fynpt != (fy_node_pair *)0x0;
        fynpt = fy_node_pair_next(&(fyn_parent_local->field_12).mapping,fynpt)) {
      fya = (fy_anchor *)fy_node_pair_alloc((fy_document *)fyn_from_local);
      if ((fy_node_pair *)fya == (fy_node_pair *)0x0) {
        fy_document_diag((fy_document *)fyn_from_local,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x730,"fy_node_copy_internal","fy_node_pair_alloc() failed");
        goto LAB_00128e90;
      }
      pfVar4 = fy_node_copy_internal((fy_document *)fyn_from_local,fynpt->key,(fy_node *)0x0);
      fya->fyn = pfVar4;
      pfVar3 = (fy_token *)fy_node_copy_internal((fy_document *)fyn_from_local,fynpt->value,fyni);
      fya->anchor = pfVar3;
      fynpt->parent = fyni;
      fy_node_pair_list_add_tail(&(fyni->field_12).mapping,(fy_node_pair *)fya);
      if ((fyni->xl != (fy_accel *)0x0) &&
         (iVar2 = fy_accel_insert(fyni->xl,fya->fyn,fya), iVar2 != 0)) {
        fy_document_diag((fy_document *)fyn_from_local,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x73a,"fy_node_copy_internal","fy_accel_insert() failed");
        goto LAB_00128e90;
      }
      if (fya->fyn != (fy_node *)0x0) {
        fya->fyn->field_0x34 = fya->fyn->field_0x34 & 0xf7 | 8;
      }
      if (fya->anchor != (fy_token *)0x0) {
        *(byte *)((long)&fya->anchor->text0 + 4) =
             *(byte *)((long)&fya->anchor->text0 + 4) & 0xf7 | 8;
      }
    }
  }
  for (anchor = (char *)fy_anchor_list_head((fy_anchor_list *)&fyn->tag);
      (anchor != (char *)0x0 && (fyn_parent_local != *(fy_node **)(anchor + 0x10)));
      anchor = (char *)fy_anchor_next((fy_anchor_list *)&fyn->tag,(fy_anchor *)anchor)) {
  }
  if (anchor == (char *)0x0) {
LAB_00128e86:
    fyd_local = (fy_document *)fyni;
  }
  else {
    fya_from = fy_document_lookup_anchor_by_token
                         ((fy_document *)fyn_from_local,*(fy_token **)(anchor + 0x18));
    if (fya_from == (fy_anchor *)0x0) {
      fy_document_diag((fy_document *)fyn_from_local,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x74f,"fy_node_copy_internal","new anchor");
      iVar2 = fy_document_register_anchor
                        ((fy_document *)fyn_from_local,fyni,*(fy_token **)(anchor + 0x18));
      if (iVar2 == 0) {
        fy_token_ref(*(fy_token **)(anchor + 0x18));
        goto LAB_00128e86;
      }
      fy_document_diag((fy_document *)fyn_from_local,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x753,"fy_node_copy_internal","fy_document_register_anchor() failed");
    }
    else {
      anchor_len = (size_t)fy_anchor_get_text(fya_from,(size_t *)&uStack_78);
      if ((char *)anchor_len != (char *)0x0) {
        fy_document_diag((fy_document *)fyn_from_local,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x75a,"fy_node_copy_internal","not overwritting anchor %.*s",uStack_78,
                         anchor_len);
        goto LAB_00128e86;
      }
      fy_document_diag((fy_document *)fyn_from_local,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x759,"fy_node_copy_internal","fy_anchor_get_text() failed");
    }
LAB_00128e90:
    fyd_local = (fy_document *)0x0;
  }
  return (fy_node *)fyd_local;
}

Assistant:

struct fy_node *fy_node_copy_internal(struct fy_document *fyd, struct fy_node *fyn_from,
                                      struct fy_node *fyn_parent) {
    struct fy_document *fyd_from;
    struct fy_node *fyn, *fyni, *fynit;
    struct fy_node_pair *fynp, *fynpt;
    struct fy_anchor *fya, *fya_from;
    const char *anchor;
    size_t anchor_len;
    int rc;

    if (!fyd || !fyn_from || !fyn_from->fyd)
        return NULL;

    fyd_from = fyn_from->fyd;

    fyn = fy_node_alloc(fyd, fyn_from->type);
    fyd_error_check(fyd, fyn, err_out,
                    "fy_node_alloc() failed");

    fyn->tag = fy_token_ref(fyn_from->tag);
    fyn->style = fyn_from->style;
    fyn->parent = fyn_parent;

    switch (fyn->type) {
        case FYNT_SCALAR:
            fyn->scalar = fy_token_ref(fyn_from->scalar);
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn_from->sequence); fyni;
                 fyni = fy_node_next(&fyn_from->sequence, fyni)) {

                fynit = fy_node_copy_internal(fyd, fyni, fyn);
                fyd_error_check(fyd, fynit, err_out,
                                "fy_node_copy_internal() failed");

                fy_node_list_add_tail(&fyn->sequence, fynit);
                fynit->attached = true;
            }

            break;
        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn_from->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn_from->mapping, fynp)) {

                fynpt = fy_node_pair_alloc(fyd);
                fyd_error_check(fyd, fynpt, err_out,
                                "fy_node_pair_alloc() failed");

                fynpt->key = fy_node_copy_internal(fyd, fynp->key, NULL);
                fynpt->value = fy_node_copy_internal(fyd, fynp->value, fyn);
                fynp->parent = fyn;

                fy_node_pair_list_add_tail(&fyn->mapping, fynpt);
                if (fyn->xl) {
                    rc = fy_accel_insert(fyn->xl, fynpt->key, fynpt);
                    fyd_error_check(fyd, !rc, err_out,
                                    "fy_accel_insert() failed");
                }
                if (fynpt->key)
                    fynpt->key->attached = true;
                if (fynpt->value)
                    fynpt->value->attached = true;
            }
            break;
    }

    /* drop an anchor to the copy */
    for (fya_from = fy_anchor_list_head(&fyd_from->anchors); fya_from;
         fya_from = fy_anchor_next(&fyd_from->anchors, fya_from)) {
        if (fyn_from == fya_from->fyn)
            break;
    }

    /* source node has an anchor */
    if (fya_from) {
        fya = fy_document_lookup_anchor_by_token(fyd, fya_from->anchor);
        if (!fya) {
            fyd_doc_debug(fyd, "new anchor");
            /* update the new anchor position */
            rc = fy_document_register_anchor(fyd, fyn, fya_from->anchor);
            fyd_error_check(fyd, !rc, err_out,
                            "fy_document_register_anchor() failed");

            fy_token_ref(fya_from->anchor);
        } else {
            anchor = fy_anchor_get_text(fya, &anchor_len);
            fyd_error_check(fyd, anchor, err_out,
                            "fy_anchor_get_text() failed");
            fyd_doc_debug(fyd, "not overwritting anchor %.*s", (int) anchor_len, anchor);
        }
    }

    return fyn;

    err_out:
    return NULL;
}